

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_extract_component_expression_abi_cxx11_
          (CompilerGLSL *this,uint32_t id,uint32_t index)

{
  bool bVar1;
  uint32_t in_ECX;
  undefined4 in_register_00000034;
  CompilerGLSL *this_00;
  char *local_58;
  undefined4 local_50;
  undefined1 local_40 [8];
  string expr;
  uint32_t local_20;
  uint32_t local_1c;
  uint32_t index_local;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  this_00 = (CompilerGLSL *)CONCAT44(in_register_00000034,id);
  local_20 = in_ECX;
  local_1c = index;
  _index_local = this_00;
  this_local = this;
  to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_40,id,SUB41(index,0));
  bVar1 = Compiler::has_extended_decoration
                    ((Compiler *)this_00,local_1c,SPIRVCrossDecorationPhysicalTypePacked);
  if (bVar1) {
    join<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
              ((spirv_cross *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (char (*) [2])0x5b2ad8,&local_20,(char (*) [2])0x5ab046);
  }
  else {
    local_58 = index_to_swizzle(this_00,local_20);
    join<std::__cxx11::string&,char_const(&)[2],char_const*>
              ((spirv_cross *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (char (*) [2])0x5b4654,&local_58);
  }
  local_50 = 1;
  ::std::__cxx11::string::~string((string *)local_40);
  return this;
}

Assistant:

string CompilerGLSL::to_extract_component_expression(uint32_t id, uint32_t index)
{
	auto expr = to_enclosed_expression(id);
	if (has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypePacked))
		return join(expr, "[", index, "]");
	else
		return join(expr, ".", index_to_swizzle(index));
}